

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::write_double<double>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
           *this,double value,format_specs *spec)

{
  undefined4 uVar1;
  undefined3 uVar2;
  char cVar3;
  bool bVar4;
  int precision;
  alignment aVar5;
  type pcVar6;
  char *local_368;
  char *local_360;
  undefined1 local_351;
  double_writer local_348;
  type local_330;
  type *local_328;
  type *it;
  undefined4 uStack_318;
  align_spec as;
  size_t n;
  format_specs normalized_spec;
  size_t size;
  char buf [100];
  char type;
  allocator<char> local_269;
  undefined1 local_268 [8];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  write_inf_or_nan_t write_inf_or_nan;
  char sign;
  float_spec_handler<char> handler;
  format_specs *spec_local;
  double value_local;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *this_local;
  
  cVar3 = basic_format_specs<char>::type(spec);
  float_spec_handler<char>::float_spec_handler
            ((float_spec_handler<char> *)&write_inf_or_nan.field_0x26,cVar3);
  cVar3 = basic_format_specs<char>::type(spec);
  internal::handle_float_type_spec<char,fmt::v5::float_spec_handler<char>&>
            (cVar3,(float_spec_handler<char> *)&write_inf_or_nan.field_0x26);
  write_inf_or_nan._37_1_ = 0;
  bVar4 = std::numeric_limits<fmt::v5::internal::dummy_int>::isnegative(value);
  if (bVar4) {
    write_inf_or_nan._37_1_ = 0x2d;
    spec_local = (format_specs *)((ulong)value ^ 0x8000000000000000);
  }
  else {
    bVar4 = basic_format_specs<char>::flag(spec,1);
    spec_local = (format_specs *)value;
    if (bVar4) {
      bVar4 = basic_format_specs<char>::flag(spec,2);
      local_351 = 0x2b;
      if (!bVar4) {
        local_351 = 0x20;
      }
      write_inf_or_nan._37_1_ = local_351;
    }
  }
  write_inf_or_nan.writer =
       *(basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
         **)&spec->super_align_spec;
  write_inf_or_nan.spec.super_align_spec._0_8_ = *(undefined8 *)&(spec->super_align_spec).align_;
  write_inf_or_nan.spec.super_align_spec.align_ = spec->precision_;
  write_inf_or_nan.spec.flags_._0_1_ = spec->type_;
  write_inf_or_nan.spec.precision_._0_1_ = write_inf_or_nan._37_1_;
  buffer._528_8_ = this;
  bVar4 = std::numeric_limits<fmt::v5::internal::dummy_int>::isnotanumber<double>
                    ((double)spec_local);
  if (bVar4) {
    if ((write_inf_or_nan._39_1_ & 1) == 0) {
      local_360 = "nan";
    }
    else {
      local_360 = "NAN";
    }
    write_double<double>::write_inf_or_nan_t::operator()
              ((write_inf_or_nan_t *)(buffer.store_ + 0x1f0),local_360);
  }
  else {
    bVar4 = std::numeric_limits<fmt::v5::internal::dummy_int>::isinfinity<double>
                      ((double)spec_local);
    if (bVar4) {
      if ((write_inf_or_nan._39_1_ & 1) == 0) {
        local_368 = "inf";
      }
      else {
        local_368 = "INF";
      }
      write_double<double>::write_inf_or_nan_t::operator()
                ((write_inf_or_nan_t *)(buffer.store_ + 0x1f0),local_368);
    }
    else {
      std::allocator<char>::allocator();
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_268,&local_269);
      std::allocator<char>::~allocator(&local_269);
      buf[99] = basic_format_specs<char>::type(spec);
      bVar4 = internal::use_grisu();
      bVar4 = internal::const_check<bool>(bVar4);
      cVar3 = buf[99];
      if (((bVar4) && (buf[99] != 'a')) && (buf[99] != 'A')) {
        normalized_spec.precision_ = 0;
        normalized_spec.type_ = '\0';
        normalized_spec._21_3_ = 0;
        precision = basic_format_specs<char>::precision(spec);
        bVar4 = basic_format_specs<char>::flag(spec,8);
        internal::grisu2_format
                  ((double)spec_local,(char *)&size,(size_t *)&normalized_spec.precision_,cVar3,
                   precision,bVar4);
        if (100 < (ulong)normalized_spec._16_8_) {
          __assert_fail("(size <= 100) && \"buffer overflow\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/lib/logging/spdlog/fmt/bundled/format.h"
                        ,0xb52,
                        "void fmt::basic_writer<fmt::output_range<std::back_insert_iterator<fmt::internal::basic_buffer<char>>, char>>::write_double(T, const format_specs &) [Range = fmt::output_range<std::back_insert_iterator<fmt::internal::basic_buffer<char>>, char>, T = double]"
                       );
        }
        internal::basic_buffer<char>::append<char>
                  ((basic_buffer<char> *)local_268,(char *)&size,buf + normalized_spec._16_8_ + -8);
      }
      else {
        uVar1 = spec->precision_;
        uVar2 = *(undefined3 *)&spec->field_0x15;
        n._0_4_ = (spec->super_align_spec).width_;
        n._4_4_ = (spec->super_align_spec).fill_;
        normalized_spec.super_align_spec._0_8_ = *(undefined8 *)&(spec->super_align_spec).align_;
        normalized_spec.flags_._0_1_ = write_inf_or_nan._38_1_;
        normalized_spec.super_align_spec.align_ = uVar1;
        normalized_spec.flags_._1_3_ = uVar2;
        write_double_sprintf<double>
                  (this,(double)spec_local,(format_specs *)&n,(basic_buffer<char> *)local_268);
      }
      as._4_8_ = internal::basic_buffer<char>::size((basic_buffer<char> *)local_268);
      it._4_4_ = (spec->super_align_spec).width_;
      uStack_318 = (spec->super_align_spec).fill_;
      as.width_ = (spec->super_align_spec).align_;
      aVar5 = align_spec::align(&spec->super_align_spec);
      if (aVar5 == ALIGN_NUMERIC) {
        if (write_inf_or_nan._37_1_ != '\0') {
          pcVar6 = reserve(this,1);
          local_328 = &local_330;
          local_330 = pcVar6 + 1;
          *pcVar6 = write_inf_or_nan._37_1_;
          write_inf_or_nan._37_1_ = 0;
          if (it._4_4_ != 0) {
            stack0xfffffffffffffce4 = CONCAT44(uStack_318,it._4_4_ + -1);
          }
        }
        as.width_ = 2;
      }
      else {
        aVar5 = align_spec::align(&spec->super_align_spec);
        if (aVar5 == ALIGN_DEFAULT) {
          as.width_ = 2;
        }
        if (write_inf_or_nan._37_1_ != '\0') {
          as._4_8_ = as._4_8_ + 1;
        }
      }
      local_348.n._0_4_ = as.fill_;
      local_348.n._4_4_ = as.align_;
      local_348.sign = write_inf_or_nan._37_1_;
      local_348.buffer = (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_268;
      basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
      ::
      write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::double_writer>
                ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                  *)this,as._4_8_,(align_spec *)((long)&it + 4),&local_348);
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_268);
    }
  }
  return;
}

Assistant:

void basic_writer<Range>::write_double(T value, const format_specs &spec) {
  // Check type.
  float_spec_handler<char_type> handler(spec.type());
  internal::handle_float_type_spec(spec.type(), handler);

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::fputil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  struct write_inf_or_nan_t {
    basic_writer &writer;
    format_specs spec;
    char sign;
    void operator()(const char *str) const {
      writer.write_padded(INF_SIZE + (sign ? 1 : 0), spec,
                          inf_or_nan_writer{sign, str});
    }
  } write_inf_or_nan = {*this, spec, sign};

  // Format NaN and ininity ourselves because sprintf's output is not consistent
  // across platforms.
  if (internal::fputil::isnotanumber(value))
    return write_inf_or_nan(handler.upper ? "NAN" : "nan");
  if (internal::fputil::isinfinity(value))
    return write_inf_or_nan(handler.upper ? "INF" : "inf");

  basic_memory_buffer<char_type> buffer;
  char type = static_cast<char>(spec.type());
  if (internal::const_check(
        internal::use_grisu() && sizeof(T) <= sizeof(double)) &&
      type != 'a' && type != 'A') {
    char buf[100]; // TODO: correct buffer size
    size_t size = 0;
    internal::grisu2_format(static_cast<double>(value), buf, size, type,
                            spec.precision(), spec.flag(HASH_FLAG));
    FMT_ASSERT(size <= 100, "buffer overflow");
    buffer.append(buf, buf + size); // TODO: avoid extra copy
  } else {
    format_specs normalized_spec(spec);
    normalized_spec.type_ = handler.type;
    write_double_sprintf(value, normalized_spec, buffer);
  }
  size_t n = buffer.size();
  align_spec as = spec;
  if (spec.align() == ALIGN_NUMERIC) {
    if (sign) {
      auto &&it = reserve(1);
      *it++ = sign;
      sign = 0;
      if (as.width_)
        --as.width_;
    }
    as.align_ = ALIGN_RIGHT;
  } else {
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    if (sign)
      ++n;
  }
  write_padded(n, as, double_writer{n, sign, buffer});
}